

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sysinfo.c
# Opt level: O1

_Bool blogc_sysinfo_get_inside_docker(void)

{
  char *__haystack;
  char *pcVar1;
  bc_error_t *err;
  size_t len;
  bc_error_t *local_20;
  size_t local_18;
  
  if (inside_docker_evaluated == '\0') {
    inside_docker_evaluated = '\x01';
    local_20 = (bc_error_t *)0x0;
    __haystack = bc_file_get_contents("/proc/1/cgroup",false,&local_18,&local_20);
    if (local_20 == (bc_error_t *)0x0) {
      pcVar1 = strstr(__haystack,"/docker/");
      free(__haystack);
      return pcVar1 != (char *)0x0;
    }
    bc_error_free(local_20);
  }
  return false;
}

Assistant:

bool
blogc_sysinfo_get_inside_docker(void)
{
    if (inside_docker_evaluated)
        return inside_docker;
    inside_docker_evaluated = true;

    size_t len;
    bc_error_t *err = NULL;
    char *contents = bc_file_get_contents("/proc/1/cgroup", false, &len, &err);
    if (err != NULL) {
        bc_error_free(err);
        inside_docker = false;
        return inside_docker;
    }

    bool inside_docker = NULL != strstr(contents, "/docker/");
    free(contents);
    return inside_docker;
}